

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_extension.cc
# Opt level: O2

PyObject * cpsm_ctrlp_match(PyObject *self,PyObject *args,PyObject *kwargs)

{
  undefined1 auVar1 [16];
  PyObjPtr PVar2;
  pointer pbVar3;
  _Alloc_hider this;
  int iVar4;
  uint uVar5;
  CtrlPMatchMode CVar6;
  Options *pOVar7;
  _Head_base<0UL,__object_*,_false> _Var8;
  tuple<_object_*,_(anonymous_namespace)::PyObjectDeleter> tVar9;
  Error *this_00;
  uint uVar10;
  pointer __p_1;
  PyObject *pPVar11;
  uint nr_threads;
  PyObject **ppPVar12;
  pointer pbVar13;
  pointer __p;
  string_ref str;
  string_ref mmode;
  string_ref query_00;
  anon_class_40_5_0524c28d *in_stack_fffffffffffffe88;
  PyObjPtr matches_list;
  int is_path;
  int limit_int;
  PyObjPtr regex_str;
  PyObjPtr output_tuple;
  int unicode;
  int max_threads_int;
  int match_crfile;
  char *highlight_mode_data;
  Py_ssize_t crfile_size;
  char *crfile_data;
  Py_ssize_t mmode_size;
  char *mmode_data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  highlight_regexes;
  string query;
  PyObjPtr regexes_list;
  undefined4 local_d0;
  Py_ssize_t regex_line_prefix_size;
  char *regex_line_prefix_data;
  Py_ssize_t query_inverting_delimiter_size;
  char *query_inverting_delimiter_data;
  Py_ssize_t highlight_mode_size;
  Py_ssize_t query_size;
  char *query_data;
  PyObject *items_obj;
  string_ref highlight_mode;
  Options mopts;
  
  limit_int = -1;
  mmode_data = (char *)0x0;
  mmode_size = 0;
  is_path = 0;
  crfile_data = (char *)0x0;
  crfile_size = 0;
  highlight_mode_data = (char *)0x0;
  highlight_mode_size = 0;
  match_crfile = 0;
  max_threads_int = 0;
  query_inverting_delimiter_data = (char *)0x0;
  query_inverting_delimiter_size = 0;
  regex_line_prefix_data = (char *)0x0;
  regex_line_prefix_size = 0;
  unicode = 0;
  ppPVar12 = &items_obj;
  iVar4 = _PyArg_ParseTupleAndKeywords_SizeT
                    (args,kwargs,"Os#|iz#iz#z#iiz#z#i",cpsm_ctrlp_match::kwlist,ppPVar12,&query_data
                     ,&query_size,&limit_int,&mmode_data,&mmode_size,&is_path,&crfile_data,
                     &crfile_size,&highlight_mode_data,&highlight_mode_size,&match_crfile,
                     &max_threads_int,&query_inverting_delimiter_data,
                     &query_inverting_delimiter_size,&regex_line_prefix_data,&regex_line_prefix_size
                     ,&unicode);
  if (iVar4 == 0) {
    pPVar11 = (PyObject *)0x0;
  }
  else {
    query._M_dataplus._M_p = (pointer)&query.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&query,query_data,query_data + query_size);
    if (query_inverting_delimiter_size != 0) {
      if (query_inverting_delimiter_size != 1) {
        this_00 = (Error *)__cxa_allocate_exception(0x28);
        cpsm::Error::Error<char_const*>
                  (this_00,"query inverting delimiter must be a single character");
        __cxa_throw(this_00,&cpsm::Error::typeinfo,cpsm::Error::~Error);
      }
      str.len_._0_4_ = (int)*query_inverting_delimiter_data;
      str.ptr_ = (char *)query._M_string_length;
      str.len_._4_4_ = 0;
      cpsm::str_split((vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
                       *)&regexes_list,(cpsm *)query._M_dataplus._M_p,str,(char)ppPVar12);
      highlight_regexes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ =
           regexes_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
           _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
           super__Head_base<0UL,__object_*,_false>._M_head_impl._4_4_;
      highlight_regexes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_d0;
      highlight_regexes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
           regexes_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
           _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
           super__Head_base<0UL,__object_*,_false>._M_head_impl._0_4_;
      highlight_regexes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
           regexes_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
           _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
           super__Head_base<0UL,__object_*,_false>._M_head_impl._4_4_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = ppPVar12;
      cpsm::
      str_join<boost::range_detail::reversed_range<std::vector<boost::basic_string_ref<char,std::char_traits<char>>,std::allocator<boost::basic_string_ref<char,std::char_traits<char>>>>const>>
                ((string *)&mopts,(cpsm *)&highlight_regexes,
                 (reversed_range<const_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>
                  *)0x138320,(string_ref)(auVar1 << 0x40));
      std::__cxx11::string::operator=((string *)&query,(string *)&mopts);
      std::__cxx11::string::~string((string *)&mopts);
      std::
      _Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
      ::~_Vector_base((_Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
                       *)&regexes_list);
    }
    iVar4 = max_threads_int;
    regexes_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
    super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
    super__Head_base<0UL,__object_*,_false>._M_head_impl =
         (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
         (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)crfile_data;
    nr_threads = 0;
    if (0 < max_threads_int) {
      nr_threads = max_threads_int;
    }
    uVar5 = std::thread::hardware_concurrency();
    uVar10 = uVar5 + (uVar5 == 0);
    if (uVar5 <= nr_threads) {
      nr_threads = uVar10;
    }
    if (iVar4 < 1) {
      nr_threads = uVar10;
    }
    pOVar7 = cpsm::Options::set_nr_threads((Options *)&regexes_list,nr_threads);
    pOVar7->path_ = is_path != 0;
    pOVar7->unicode_ = unicode != 0;
    pOVar7->want_match_info_ = true;
    mopts.crfile_.ptr_ = (pOVar7->crfile_).ptr_;
    mopts.crfile_.len_ = (pOVar7->crfile_).len_;
    mopts.limit_._0_4_ = (undefined4)pOVar7->limit_;
    mopts.limit_._4_4_ = *(undefined4 *)((long)&pOVar7->limit_ + 4);
    mopts.match_crfile_ = pOVar7->match_crfile_;
    mopts._25_3_ = *(undefined3 *)&pOVar7->field_0x19;
    mopts.nr_threads_ = pOVar7->nr_threads_;
    mopts.path_ = pOVar7->path_;
    mopts.unicode_ = pOVar7->unicode_;
    mopts.want_match_info_ = pOVar7->want_match_info_;
    mopts._35_5_ = *(undefined5 *)&pOVar7->field_0x23;
    highlight_mode.ptr_ = highlight_mode_data;
    highlight_mode.len_ = highlight_mode_size;
    _Var8._M_head_impl = (_object *)PyTuple_New(2);
    output_tuple._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
    super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
    super__Head_base<0UL,__object_*,_false>._M_head_impl =
         (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
         (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
         _Var8._M_head_impl;
    if ((tuple<_object_*,_(anonymous_namespace)::PyObjectDeleter>)_Var8._M_head_impl ==
        (_Head_base<0UL,__object_*,_false>)0x0) {
      pPVar11 = (PyObject *)0x0;
    }
    else {
      matches_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
      super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
      super__Head_base<0UL,__object_*,_false>._M_head_impl =
           (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
           PyList_New(0);
      this = query._M_dataplus;
      if ((tuple<_object_*,_(anonymous_namespace)::PyObjectDeleter>)
          matches_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
          _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
          super__Head_base<0UL,__object_*,_false>._M_head_impl ==
          (_Head_base<0UL,__object_*,_false>)0x0) {
        _Var8._M_head_impl = (PyObject *)0x0;
        matches_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
        _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
        super__Head_base<0UL,__object_*,_false>._M_head_impl =
             (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
             (__uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>)0x0;
      }
      else {
        highlight_regexes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        highlight_regexes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        highlight_regexes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        mmode.len_ = mmode_size;
        mmode.ptr_ = mmode_data;
        CVar6 = cpsm::parse_ctrlp_match_mode(mmode);
        regexes_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
        _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
        super__Head_base<0UL,__object_*,_false>._M_head_impl =
             (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
             &matches_list;
        query_00.len_ = (size_t)&mopts;
        query_00.ptr_ = (char *)query._M_string_length;
        (anonymous_namespace)::
        for_each_pyctrlp_match<cpsm_ctrlp_match(_object*,_object*,_object*)::__0>
                  ((_anonymous_namespace_ *)this._M_p,query_00,(Options *)(ulong)CVar6,
                   (CtrlPMatchMode)items_obj,(PyObject *)&regexes_list,in_stack_fffffffffffffe88);
        PVar2 = matches_list;
        matches_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
        _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
        super__Head_base<0UL,__object_*,_false>._M_head_impl =
             (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
             (__uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>)0x0;
        iVar4 = PyTuple_SetItem(_Var8._M_head_impl,0,
                                PVar2._M_t.
                                super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>
                                ._M_t.
                                super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>
                                .super__Head_base<0UL,__object_*,_false>._M_head_impl);
        if (iVar4 == 0) {
          tVar9.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
          super__Head_base<0UL,__object_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>)PyList_New(0);
          regexes_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
          _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
          super__Head_base<0UL,__object_*,_false>._M_head_impl =
               (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
               (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
               tVar9.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
               super__Head_base<0UL,__object_*,_false>._M_head_impl;
          if (tVar9.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
              super__Head_base<0UL,__object_*,_false>._M_head_impl !=
              (_Head_base<0UL,__object_*,_false>)0x0) {
            pbVar3 = highlight_regexes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar13 = highlight_regexes.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              if (pbVar13 == pbVar3) {
                regexes_list._M_t.
                super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
                super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
                super__Head_base<0UL,__object_*,_false>._M_head_impl =
                     (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
                     (__uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>)0x0;
                iVar4 = PyTuple_SetItem(_Var8._M_head_impl,1,
                                        tVar9.
                                        super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>
                                        .super__Head_base<0UL,__object_*,_false>._M_head_impl);
                if (iVar4 == 0) {
                  output_tuple._M_t.
                  super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
                  super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
                  super__Head_base<0UL,__object_*,_false>._M_head_impl =
                       (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>
                       )(__uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>)0x0;
                  goto LAB_00114b5f;
                }
                break;
              }
              regex_str._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
              _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
              super__Head_base<0UL,__object_*,_false>._M_head_impl =
                   (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
                   PyUnicode_FromStringAndSize
                             ((pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
              if ((tuple<_object_*,_(anonymous_namespace)::PyObjectDeleter>)
                  regex_str._M_t.
                  super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
                  super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
                  super__Head_base<0UL,__object_*,_false>._M_head_impl ==
                  (_Head_base<0UL,__object_*,_false>)0x0) {
                std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                          (&regex_str);
                break;
              }
              iVar4 = PyList_Append(tVar9.
                                    super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>
                                    .super__Head_base<0UL,__object_*,_false>._M_head_impl,
                                    regex_str._M_t.
                                    super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>
                                    .super__Head_base<0UL,__object_*,_false>._M_head_impl);
              std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                        (&regex_str);
              pbVar13 = pbVar13 + 1;
            } while (-1 < iVar4);
          }
          _Var8._M_head_impl = (PyObject *)0x0;
LAB_00114b5f:
          std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                    (&regexes_list);
        }
        else {
          _Var8._M_head_impl = (PyObject *)0x0;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&highlight_regexes);
      }
      std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr(&matches_list);
      pPVar11 = _Var8._M_head_impl;
    }
    std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr(&output_tuple);
    std::__cxx11::string::~string((string *)&query);
  }
  return pPVar11;
}

Assistant:

static PyObject* cpsm_ctrlp_match(PyObject* self, PyObject* args,
                                  PyObject* kwargs) {
  static char const* kwlist[] = {"items", "query", "limit", "mmode", "ispath",
                                 "crfile", "highlight_mode", "match_crfile",
                                 "max_threads", "query_inverting_delimiter",
                                 "regex_line_prefix", "unicode", nullptr};
  // Required parameters.
  PyObject* items_obj;
  char const* query_data;
  Py_ssize_t query_size;
  // CtrlP-provided options.
  int limit_int = -1;
  char const* mmode_data = nullptr;
  Py_ssize_t mmode_size = 0;
  int is_path = 0;
  char const* crfile_data = nullptr;
  Py_ssize_t crfile_size = 0;
  // cpsm-specific options.
  char const* highlight_mode_data = nullptr;
  Py_ssize_t highlight_mode_size = 0;
  int match_crfile = 0;
  int max_threads_int = 0;
  char const* query_inverting_delimiter_data = nullptr;
  Py_ssize_t query_inverting_delimiter_size = 0;
  char const* regex_line_prefix_data = nullptr;
  Py_ssize_t regex_line_prefix_size = 0;
  int unicode = 0;
  if (!PyArg_ParseTupleAndKeywords(
          args, kwargs, "Os#|iz#iz#z#iiz#z#i", const_cast<char**>(kwlist),
          &items_obj, &query_data, &query_size, &limit_int, &mmode_data,
          &mmode_size, &is_path, &crfile_data, &crfile_size,
          &highlight_mode_data, &highlight_mode_size, &match_crfile,
          &max_threads_int, &query_inverting_delimiter_data,
          &query_inverting_delimiter_size, &regex_line_prefix_data,
          &regex_line_prefix_size, &unicode)) {
    return nullptr;
  }

  try {
    std::string query(query_data, query_size);
    boost::string_ref query_inverting_delimiter(query_inverting_delimiter_data,
                                                query_inverting_delimiter_size);
    if (!query_inverting_delimiter.empty()) {
      if (query_inverting_delimiter.size() > 1) {
        throw cpsm::Error(
            "query inverting delimiter must be a single character");
      }
      query = cpsm::str_join(boost::adaptors::reverse(cpsm::str_split(
                                 query, query_inverting_delimiter[0])),
                             "");
    }

    auto const mopts =
        cpsm::Options()
            .set_crfile(boost::string_ref(crfile_data, crfile_size))
            .set_limit((limit_int >= 0) ? std::size_t(limit_int) : 0)
            .set_match_crfile(match_crfile)
            .set_nr_threads(
                 get_nr_threads((max_threads_int >= 0)
                                    ? static_cast<unsigned int>(max_threads_int)
                                    : 0))
            .set_path(is_path)
            .set_unicode(unicode)
            .set_want_match_info(true);
    boost::string_ref const highlight_mode(highlight_mode_data,
                                           highlight_mode_size);

    PyObjPtr output_tuple(PyTuple_New(2));
    if (!output_tuple) {
      return nullptr;
    }
    PyObjPtr matches_list(PyList_New(0));
    if (!matches_list) {
      return nullptr;
    }
    std::vector<std::string> highlight_regexes;
    for_each_pyctrlp_match(
        query, mopts,
        cpsm::parse_ctrlp_match_mode(boost::string_ref(mmode_data, mmode_size)),
        items_obj,
        [&](boost::string_ref const item, boost::string_ref const match_key,
            PyObject* const obj, cpsm::MatchInfo* const info) {
          if (PyList_Append(matches_list.get(), obj) < 0) {
            throw cpsm::Error("match appending failed");
          }
          auto match_positions = info->match_positions();
          // Adjust match positions to account for substringing.
          std::size_t const delta = match_key.data() - item.data();
          for (auto& pos : match_positions) {
            pos += delta;
          }
          cpsm::get_highlight_regexes(
              highlight_mode, item, match_positions, highlight_regexes,
              boost::string_ref(regex_line_prefix_data,
                                regex_line_prefix_size));
        });
    if (PyTuple_SetItem(output_tuple.get(), 0, matches_list.release())) {
      return nullptr;
    }
    PyObjPtr regexes_list(PyList_New(0));
    if (!regexes_list) {
      return nullptr;
    }
    for (auto const& regex : highlight_regexes) {
      PyObjPtr regex_str(
          PyVimString_FromStringAndSize(regex.data(), regex.size()));
      if (!regex_str) {
        return nullptr;
      }
      if (PyList_Append(regexes_list.get(), regex_str.get()) < 0) {
        return nullptr;
      }
    }
    if (PyTuple_SetItem(output_tuple.get(), 1, regexes_list.release())) {
      return nullptr;
    }
    return output_tuple.release();
  } catch (std::exception const& ex) {
    PyErr_SetString(PyExc_RuntimeError, ex.what());
    return nullptr;
  }
}